

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O3

void __thiscall interfaces_tests::findBlock::test_method(findBlock *this)

{
  long lVar1;
  lazy_ostream *plVar2;
  Chain *pCVar3;
  uint256 *puVar4;
  pointer ppCVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  base_blob<256U> *pbVar10;
  int iVar11;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar12;
  Chainstate *pCVar13;
  CBlockIndex *pCVar14;
  char *pcVar15;
  iterator pvVar16;
  iterator in_R9;
  iterator pvVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  check_type cVar24;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 local_43c [20];
  char *local_428;
  char *local_420;
  bool next_active;
  bool cur_active;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  int64_t mtp_time;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  int64_t max_time;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  int64_t time;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  int height;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 local_210 [8];
  undefined1 local_208 [8];
  element_type *local_200;
  char *local_1f8;
  assertion_result local_1f0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined1 local_1c8 [8];
  bool bStack_1c0;
  undefined7 uStack_1bf;
  shared_count local_1b8;
  assertion_result *paStack_1b0;
  undefined8 uStack_1a8;
  bool *local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined1 local_178 [8];
  bool bStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  uchar uStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  uchar uStack_169;
  shared_count local_168;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  uchar uStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  uchar uStack_159;
  undefined1 local_158 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_150;
  undefined8 uStack_140;
  lazy_ostream local_138;
  undefined1 local_128 [8];
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 *puStack_d8;
  int **ppiStack_d0;
  undefined8 uStack_c8;
  uchar local_c0 [40];
  undefined1 local_98 [11];
  undefined5 uStack_8d;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  uint256 next_hash;
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar12 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar12,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x14,"test_method","m_node.chainman");
  criticalblock11.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock11.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock11.super_unique_lock);
  pcVar15 = "m_node.chainman";
  puVar12 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (puVar12,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                       ,0x16,"test_method","m_node.chainman");
  pCVar13 = ChainstateManager::ActiveChainstate
                      ((puVar12->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x19;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = pcVar15;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  plVar2 = (lazy_ostream *)
           (pCVar13->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_start[10]->phashBlock;
  if (plVar2 != (lazy_ostream *)0x0) {
    pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    local_138 = *plVar2;
    _local_128 = plVar2[1];
    local_c0[0x10] = '\0';
    local_c0[0x11] = '\0';
    local_c0[0x12] = '\0';
    local_c0[0x13] = '\0';
    local_c0[0x14] = '\0';
    local_c0[0x15] = '\0';
    local_c0[0x16] = '\0';
    local_c0[0x17] = '\0';
    local_c0._24_8_ = 0;
    local_c0[0] = '\0';
    local_c0[1] = '\0';
    local_c0[2] = '\0';
    local_c0[3] = '\0';
    local_c0[4] = '\0';
    local_c0[5] = '\0';
    local_c0[6] = '\0';
    local_c0[7] = '\0';
    local_c0[8] = '\0';
    local_c0[9] = '\0';
    local_c0[10] = '\0';
    local_c0[0xb] = '\0';
    local_c0[0xc] = '\0';
    local_c0[0xd] = '\0';
    local_c0[0xe] = '\0';
    local_c0[0xf] = '\0';
    ppiStack_d0 = (int **)0x0;
    uStack_c8._0_1_ = '\0';
    uStack_c8._1_1_ = '\0';
    uStack_c8._2_1_ = '\0';
    uStack_c8._3_1_ = '\0';
    uStack_c8._4_1_ = '\0';
    uStack_c8._5_1_ = '\0';
    uStack_c8._6_1_ = '\0';
    uStack_c8._7_1_ = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    puStack_d8 = (undefined1 *)0x0;
    local_c0._32_8_ = 0;
    local_e8._0_8_ = &hash;
    _cVar24 = 0x3f62ce;
    iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,&local_138,local_e8);
    next_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar11;
    next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    paStack_1b0 = (assertion_result *)local_158;
    local_158 = (undefined1  [8])0xe9f044;
    sStack_150.px = (element_type *)0xe9f089;
    bStack_1c0 = false;
    local_1c8[0] = (class_property<bool>)0xc8;
    local_1c8._1_7_ = 0x13ae1;
    local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_240 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
    ;
    local_238 = "";
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&next_hash,(lazy_ostream *)local_1c8,1,0,WARN,_cVar24,
               (size_t)&local_240,0x19);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
    ;
    local_248 = "";
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1a;
    file_00.m_begin = (iterator)&local_250;
    msg_00.m_end = pvVar17;
    msg_00.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_260,
               msg_00);
    bStack_1c0 = false;
    local_1c8[0] = (class_property<bool>)0x88;
    local_1c8._1_7_ = 0x13ae0;
    local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    paStack_1b0 = (assertion_result *)0xf73bdc;
    puVar4 = (pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[10]->phashBlock;
    if (puVar4 != (uint256 *)0x0) {
      next_hash.super_base_blob<256U>.m_data._M_elems[0] = *(uchar *)&puVar4->super_base_blob<256U>;
      next_hash.super_base_blob<256U>.m_data._M_elems[1] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[1];
      next_hash.super_base_blob<256U>.m_data._M_elems[2] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[2];
      next_hash.super_base_blob<256U>.m_data._M_elems[3] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[3];
      next_hash.super_base_blob<256U>.m_data._M_elems[4] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[4];
      next_hash.super_base_blob<256U>.m_data._M_elems[5] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[5];
      next_hash.super_base_blob<256U>.m_data._M_elems[6] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[6];
      next_hash.super_base_blob<256U>.m_data._M_elems[7] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[7];
      next_hash.super_base_blob<256U>.m_data._M_elems[8] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[8];
      next_hash.super_base_blob<256U>.m_data._M_elems[9] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[9];
      next_hash.super_base_blob<256U>.m_data._M_elems[10] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[10];
      next_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0xb];
      next_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0xc];
      next_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0xd];
      next_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0xe];
      next_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0xf];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x10];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x11];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x12];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x13];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x14];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x15];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x16];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x17];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x18];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x19];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x1a];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x1b];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x1c];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x1d];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x1e];
      next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           (puVar4->super_base_blob<256U>).m_data._M_elems[0x1f];
      auVar21[0] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar21[1] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar21[2] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar21[3] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar21[4] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar21[5] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar21[6] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar21[7] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar21[8] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar21[9] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar21[10] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar21[0xb] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar21[0xc] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar21[0xd] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar21[0xe] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar21[0xf] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar18[0] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                    hash.super_base_blob<256U>.m_data._M_elems[0]);
      auVar18[1] = -(next_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                    hash.super_base_blob<256U>.m_data._M_elems[1]);
      auVar18[2] = -(next_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                    hash.super_base_blob<256U>.m_data._M_elems[2]);
      auVar18[3] = -(next_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                    hash.super_base_blob<256U>.m_data._M_elems[3]);
      auVar18[4] = -(next_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                    hash.super_base_blob<256U>.m_data._M_elems[4]);
      auVar18[5] = -(next_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                    hash.super_base_blob<256U>.m_data._M_elems[5]);
      auVar18[6] = -(next_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                    hash.super_base_blob<256U>.m_data._M_elems[6]);
      auVar18[7] = -(next_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                    hash.super_base_blob<256U>.m_data._M_elems[7]);
      auVar18[8] = -(next_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                    hash.super_base_blob<256U>.m_data._M_elems[8]);
      auVar18[9] = -(next_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                    hash.super_base_blob<256U>.m_data._M_elems[9]);
      auVar18[10] = -(next_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                     hash.super_base_blob<256U>.m_data._M_elems[10]);
      auVar18[0xb] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar18[0xc] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar18[0xd] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar18[0xe] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar18[0xf] = -(next_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      hash.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar18 = auVar18 & auVar21;
      local_158[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
      sStack_150.px = (element_type *)0x0;
      sStack_150.pn.pi_ = (sp_counted_base *)0x0;
      local_178 = (undefined1  [8])0xe9efd7;
      bStack_170 = true;
      uStack_16f = 0xf0;
      uStack_16e = 0xe9;
      uStack_16d = '\0';
      uStack_16c = '\0';
      uStack_16b = '\0';
      uStack_16a = '\0';
      uStack_169 = '\0';
      ppiStack_d0 = (int **)&local_1f0;
      local_1f0._0_8_ = &hash;
      local_e8[8] = '\0';
      local_e8._0_8_ = &PTR__lazy_ostream_013aed38;
      puStack_d8 = boost::unit_test::lazy_ostream::inst;
      local_138.m_empty = false;
      local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013aed38;
      uStack_120 = (int *)&local_200;
      local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      pvVar16 = (iterator)0x1;
      pvVar17 = (iterator)0x2;
      local_200 = (element_type *)&next_hash;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_158,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xfc3c82,
                 (size_t)local_178,0x1a,local_e8,"active[10]->GetBlockHash()",&local_138);
      boost::detail::shared_count::~shared_count(&sStack_150.pn);
      height = -1;
      local_278 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_270 = "";
      local_288 = &boost::unit_test::basic_cstring<char_const>::null;
      local_280 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x1d;
      file_01.m_begin = (iterator)&local_278;
      msg_01.m_end = pvVar17;
      msg_01.m_begin = pvVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
                 msg_01);
      plVar2 = (lazy_ostream *)
               (pCVar13->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_start[0x14]->phashBlock;
      if (plVar2 != (lazy_ostream *)0x0) {
        pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
        local_138 = *plVar2;
        local_128 = (undefined1  [8])plVar2[1]._vptr_lazy_ostream;
        uStack_120._0_1_ = plVar2[1].m_empty;
        uStack_120._1_7_ = *(undefined7 *)&plVar2[1].field_0x9;
        local_e8._0_4_ = 0;
        local_e8[4] = '\0';
        local_e8[5] = '\0';
        local_e8[6] = '\0';
        local_e8[7] = '\0';
        local_c0._24_8_ = 0;
        local_c0._32_8_ = 0;
        local_c0[8] = '\0';
        local_c0[9] = '\0';
        local_c0[10] = '\0';
        local_c0[0xb] = '\0';
        local_c0[0xc] = '\0';
        local_c0[0xd] = '\0';
        local_c0[0xe] = '\0';
        local_c0[0xf] = '\0';
        local_c0[0x10] = '\0';
        local_c0[0x11] = '\0';
        local_c0[0x12] = '\0';
        local_c0[0x13] = '\0';
        local_c0[0x14] = '\0';
        local_c0[0x15] = '\0';
        local_c0[0x16] = '\0';
        local_c0[0x17] = '\0';
        uStack_c8._0_1_ = '\0';
        uStack_c8._1_1_ = '\0';
        uStack_c8._2_1_ = '\0';
        uStack_c8._3_1_ = '\0';
        uStack_c8._4_1_ = '\0';
        uStack_c8._5_1_ = '\0';
        uStack_c8._6_1_ = '\0';
        uStack_c8._7_1_ = '\0';
        local_c0[0] = '\0';
        local_c0[1] = '\0';
        local_c0[2] = '\0';
        local_c0[3] = '\0';
        local_c0[4] = '\0';
        local_c0[5] = '\0';
        local_c0[6] = '\0';
        local_c0[7] = '\0';
        puStack_d8 = (undefined1 *)0x0;
        ppiStack_d0 = (int **)0x0;
        local_e8[8] = (uchar)&height;
        local_e8._9_7_ = (undefined7)((ulong)&height >> 8);
        _cVar24 = 0x3f65da;
        iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,&local_138,local_e8);
        next_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar11;
        next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_158 = (undefined1  [8])0xe9f0a5;
        sStack_150.px = (element_type *)0xe9f0ee;
        bStack_1c0 = false;
        local_1c8[0] = (class_property<bool>)0xc8;
        local_1c8._1_7_ = 0x13ae1;
        local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_298 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_290 = "";
        pvVar16 = (iterator)0x1;
        pvVar17 = (iterator)0x0;
        paStack_1b0 = (assertion_result *)local_158;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&next_hash,(lazy_ostream *)local_1c8,1,0,WARN,_cVar24,
                   (size_t)&local_298,0x1d);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
        local_2a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_2a0 = "";
        local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x1e;
        file_02.m_begin = (iterator)&local_2a8;
        msg_02.m_end = pvVar17;
        msg_02.m_begin = pvVar16;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8
                   ,msg_02);
        bStack_1c0 = false;
        local_1c8[0] = (class_property<bool>)0x88;
        local_1c8._1_7_ = 0x13ae0;
        local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        paStack_1b0 = (assertion_result *)0xf73bdc;
        ppCVar5 = (pCVar13->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(pCVar13->m_chain).vChain.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5) >> 3) <
            0x15) {
          pCVar14 = (CBlockIndex *)0x0;
        }
        else {
          pCVar14 = ppCVar5[0x14];
        }
        local_1f0._0_8_ = &pCVar14->nHeight;
        next_hash.super_base_blob<256U>.m_data._M_elems[0] = height == pCVar14->nHeight;
        next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_158 = (undefined1  [8])0xe9efd7;
        sStack_150.px = (element_type *)0xe9f039;
        local_e8[8] = '\0';
        local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
        puStack_d8 = boost::unit_test::lazy_ostream::inst;
        ppiStack_d0 = (int **)local_178;
        local_138.m_empty = false;
        local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
        uStack_120 = (int *)&local_1f0;
        local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
        pvVar16 = (iterator)0x1;
        pvVar17 = (iterator)0x2;
        local_178 = (undefined1  [8])&height;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&next_hash,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xfcb3f0,
                   (size_t)local_158,0x1e,local_e8,"active[20]->nHeight",&local_138);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
        aStack_88._0_11_ = SUB1611((undefined1  [16])0x0,5);
        local_98 = SUB1611((undefined1  [16])0x0,0);
        uStack_8d = 0;
        local_c0._24_8_ = 0;
        local_c0._32_8_ = 0;
        local_c0[8] = '\0';
        local_c0[9] = '\0';
        local_c0[10] = '\0';
        local_c0[0xb] = '\0';
        local_c0[0xc] = '\0';
        local_c0[0xd] = '\0';
        local_c0[0xe] = '\0';
        local_c0[0xf] = '\0';
        local_c0[0x10] = '\0';
        local_c0[0x11] = '\0';
        local_c0[0x12] = '\0';
        local_c0[0x13] = '\0';
        local_c0[0x14] = '\0';
        local_c0[0x15] = '\0';
        local_c0[0x16] = '\0';
        local_c0[0x17] = '\0';
        uStack_c8._0_1_ = '\0';
        uStack_c8._1_1_ = '\0';
        uStack_c8._2_1_ = '\0';
        uStack_c8._3_1_ = '\0';
        uStack_c8._4_1_ = '\0';
        uStack_c8._5_1_ = '\0';
        uStack_c8._6_1_ = '\0';
        uStack_c8._7_1_ = '\0';
        local_c0[0] = '\0';
        local_c0[1] = '\0';
        local_c0[2] = '\0';
        local_c0[3] = '\0';
        local_c0[4] = '\0';
        local_c0[5] = '\0';
        local_c0[6] = '\0';
        local_c0[7] = '\0';
        puStack_d8 = (undefined1 *)0x0;
        ppiStack_d0 = (int **)0x0;
        local_e8._0_8_ = (uint256 *)0x0;
        local_e8[8] = '\0';
        local_e8[9] = '\0';
        local_e8[10] = '\0';
        local_e8[0xb] = '\0';
        local_e8[0xc] = '\0';
        local_e8[0xd] = '\0';
        local_e8[0xe] = '\0';
        local_e8[0xf] = '\0';
        local_2c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_2c0 = "";
        local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x21;
        file_03.m_begin = (iterator)&local_2c8;
        msg_03.m_end = pvVar17;
        msg_03.m_begin = pvVar16;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8
                   ,msg_03);
        puVar4 = (pCVar13->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start[0x1e]->phashBlock;
        if (puVar4 != (uint256 *)0x0) {
          pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                   super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                   .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
          uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
          local_1b8.pi_ =
               *(sp_counted_base **)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
          paStack_1b0 = *(assertion_result **)
                         ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
          local_1c8[0] = SUB81(*(undefined8 *)&puVar4->super_base_blob<256U>,0);
          local_1c8._1_7_ = (undefined7)((ulong)*(undefined8 *)&puVar4->super_base_blob<256U> >> 8);
          bStack_1c0 = SUB81(uVar6,0);
          uStack_1bf = (undefined7)((ulong)uVar6 >> 8);
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_128 = (undefined1  [8])0x0;
          uStack_120._0_1_ = false;
          uStack_120._1_7_ = 0;
          local_138._vptr_lazy_ostream = (_func_int **)0x0;
          local_138.m_empty = false;
          local_138._9_7_ = 0;
          local_f8._8_8_ = 0;
          local_f8._0_8_ = local_e8;
          _cVar24 = 0x3f68e2;
          iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,local_1c8,&local_138);
          local_158[0] = (class_property<bool>)(class_property<bool>)(char)iVar11;
          sStack_150.px = (element_type *)0x0;
          sStack_150.pn.pi_ = (sp_counted_base *)0x0;
          local_178 = (undefined1  [8])0xe9f103;
          bStack_170 = true;
          uStack_16f = 0xf1;
          uStack_16e = 0xe9;
          uStack_16d = '\0';
          uStack_16c = '\0';
          uStack_16b = '\0';
          uStack_16a = '\0';
          uStack_169 = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0] = 200;
          next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
          next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
          next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
          next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          builtin_memcpy(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)local_178;
          next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)local_178 >> 8);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)local_178 >> 0x10);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)local_178 >> 0x18);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)local_178 >> 0x20);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)local_178 >> 0x28);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)local_178 >> 0x30);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)local_178 >> 0x38);
          local_2e8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_2e0 = "";
          pvVar16 = (iterator)0x1;
          pvVar17 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,0,WARN,_cVar24,
                     (size_t)&local_2e8,0x21);
          boost::detail::shared_count::~shared_count(&sStack_150.pn);
          local_2f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_2f0 = "";
          local_308 = &boost::unit_test::basic_cstring<char_const>::null;
          local_300 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0x22;
          file_04.m_begin = (iterator)&local_2f8;
          msg_04.m_end = pvVar17;
          msg_04.m_begin = pvVar16;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_308,msg_04);
          next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0] = 0x88;
          next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
          next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
          next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
          next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          builtin_memcpy(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
          next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = 0xdc;
          next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = ';';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf7;
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          CBlockHeader::GetHash((uint256 *)local_158,(CBlockHeader *)local_e8);
          puVar4 = (pCVar13->m_chain).vChain.
                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                   super__Vector_impl_data._M_start[0x1e]->phashBlock;
          if (puVar4 != (uint256 *)0x0) {
            local_178 = *(undefined1 (*) [8])&puVar4->super_base_blob<256U>;
            bStack_170 = (bool)(puVar4->super_base_blob<256U>).m_data._M_elems[8];
            uStack_16f = (puVar4->super_base_blob<256U>).m_data._M_elems[9];
            uStack_16e = (puVar4->super_base_blob<256U>).m_data._M_elems[10];
            uStack_16d = (puVar4->super_base_blob<256U>).m_data._M_elems[0xb];
            uStack_16c = (puVar4->super_base_blob<256U>).m_data._M_elems[0xc];
            uStack_16b = (puVar4->super_base_blob<256U>).m_data._M_elems[0xd];
            uStack_16a = (puVar4->super_base_blob<256U>).m_data._M_elems[0xe];
            uStack_169 = (puVar4->super_base_blob<256U>).m_data._M_elems[0xf];
            auVar18 = *(undefined1 (*) [16])((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10)
            ;
            auVar19[0] = -((bool)*(class_property<bool> *)&puVar4->super_base_blob<256U> ==
                          local_158[0]);
            auVar19[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[1] == local_158[1]);
            auVar19[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[2] == local_158[2]);
            auVar19[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[3] == local_158[3]);
            auVar19[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[4] == local_158[4]);
            auVar19[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[5] == local_158[5]);
            auVar19[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[6] == local_158[6]);
            auVar19[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[7] == local_158[7]);
            auVar19[8] = -(bStack_170 == sStack_150.px._0_1_);
            auVar19[9] = -(uStack_16f == sStack_150.px._1_1_);
            auVar19[10] = -(uStack_16e == sStack_150.px._2_1_);
            auVar19[0xb] = -(uStack_16d == sStack_150.px._3_1_);
            auVar19[0xc] = -(uStack_16c == sStack_150.px._4_1_);
            auVar19[0xd] = -(uStack_16b == sStack_150.px._5_1_);
            auVar19[0xe] = -(uStack_16a == sStack_150.px._6_1_);
            auVar19[0xf] = -(uStack_169 == sStack_150.px._7_1_);
            local_168.pi_._0_1_ = auVar18[0];
            auVar23[0] = -((uchar)sStack_150.pn.pi_ == (uchar)local_168.pi_);
            local_168.pi_._1_1_ = auVar18[1];
            auVar23[1] = -(sStack_150.pn.pi_._1_1_ == local_168.pi_._1_1_);
            local_168.pi_._2_1_ = auVar18[2];
            auVar23[2] = -(sStack_150.pn.pi_._2_1_ == local_168.pi_._2_1_);
            local_168.pi_._3_1_ = auVar18[3];
            auVar23[3] = -(sStack_150.pn.pi_._3_1_ == local_168.pi_._3_1_);
            local_168.pi_._4_1_ = auVar18[4];
            auVar23[4] = -(sStack_150.pn.pi_._4_1_ == local_168.pi_._4_1_);
            local_168.pi_._5_1_ = auVar18[5];
            auVar23[5] = -(sStack_150.pn.pi_._5_1_ == local_168.pi_._5_1_);
            local_168.pi_._6_1_ = auVar18[6];
            auVar23[6] = -(sStack_150.pn.pi_._6_1_ == local_168.pi_._6_1_);
            local_168.pi_._7_1_ = auVar18[7];
            auVar23[7] = -(sStack_150.pn.pi_._7_1_ == local_168.pi_._7_1_);
            uStack_160 = auVar18[8];
            auVar23[8] = -((uchar)uStack_140 == uStack_160);
            uStack_15f = auVar18[9];
            auVar23[9] = -(uStack_140._1_1_ == uStack_15f);
            uStack_15e = auVar18[10];
            auVar23[10] = -(uStack_140._2_1_ == uStack_15e);
            uStack_15d = auVar18[0xb];
            auVar23[0xb] = -(uStack_140._3_1_ == uStack_15d);
            uStack_15c = auVar18[0xc];
            auVar23[0xc] = -(uStack_140._4_1_ == uStack_15c);
            uStack_15b = auVar18[0xd];
            auVar23[0xd] = -(uStack_140._5_1_ == uStack_15b);
            uStack_15a = auVar18[0xe];
            auVar23[0xe] = -(uStack_140._6_1_ == uStack_15a);
            uStack_159 = auVar18[0xf];
            auVar23[0xf] = -(uStack_140._7_1_ == uStack_159);
            auVar19 = auVar19 & auVar23;
            local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)
                    (readonly_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
            local_1f0.m_message.px = (element_type *)0x0;
            local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_200 = (element_type *)0xe9efd7;
            local_1f8 = "";
            local_138.m_empty = false;
            local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013aed38;
            uStack_120 = (int *)local_208;
            local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
            paStack_1b0 = (assertion_result *)local_210;
            local_210 = (undefined1  [8])local_178;
            bStack_1c0 = false;
            local_1c8[0] = (class_property<bool>)0x38;
            local_1c8._1_7_ = 0x13aed;
            local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            pvVar16 = (iterator)0x1;
            pvVar17 = (iterator)0x2;
            local_208 = (undefined1  [8])local_158;
            boost::test_tools::tt_detail::report_assertion
                      (&local_1f0,(lazy_ostream *)&next_hash,1,2,REQUIRE,0xe9f149,(size_t)&local_200
                       ,0x22,&local_138,"active[30]->GetBlockHash()",local_1c8);
            boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
            time = -1;
            local_320 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
            ;
            local_318 = "";
            local_330 = &boost::unit_test::basic_cstring<char_const>::null;
            local_328 = &boost::unit_test::basic_cstring<char_const>::null;
            file_05.m_end = (iterator)0x25;
            file_05.m_begin = (iterator)&local_320;
            msg_05.m_end = pvVar17;
            msg_05.m_begin = pvVar16;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                       (size_t)&local_330,msg_05);
            puVar4 = (pCVar13->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start[0x28]->phashBlock;
            if (puVar4 != (uint256 *)0x0) {
              pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                       super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                       .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
              uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
              local_1b8.pi_ =
                   *(sp_counted_base **)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
              pbVar10 = &puVar4->super_base_blob<256U>;
              paStack_1b0._0_1_ = (pbVar10->m_data)._M_elems[0x18];
              paStack_1b0._1_1_ = (pbVar10->m_data)._M_elems[0x19];
              paStack_1b0._2_1_ = (pbVar10->m_data)._M_elems[0x1a];
              paStack_1b0._3_1_ = (pbVar10->m_data)._M_elems[0x1b];
              paStack_1b0._4_1_ = (pbVar10->m_data)._M_elems[0x1c];
              paStack_1b0._5_1_ = (pbVar10->m_data)._M_elems[0x1d];
              paStack_1b0._6_1_ = (pbVar10->m_data)._M_elems[0x1e];
              paStack_1b0._7_1_ = (pbVar10->m_data)._M_elems[0x1f];
              local_1c8[0] = SUB81(*(undefined8 *)&puVar4->super_base_blob<256U>,0);
              local_1c8._1_7_ =
                   (undefined7)((ulong)*(undefined8 *)&puVar4->super_base_blob<256U> >> 8);
              bStack_1c0 = SUB81(uVar6,0);
              uStack_1bf = (undefined7)((ulong)uVar6 >> 8);
              local_f8 = (undefined1  [16])0x0;
              local_108 = (undefined1  [16])0x0;
              local_118 = (undefined1  [16])0x0;
              local_138._vptr_lazy_ostream = (_func_int **)0x0;
              local_138.m_empty = false;
              local_138._9_7_ = 0;
              uStack_120 = (int *)0x0;
              _cVar24 = 0x3f6c0c;
              local_128 = (undefined1  [8])&time;
              iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,local_1c8,&local_138);
              sStack_150.px = (element_type *)0x0;
              sStack_150.pn.pi_ = (sp_counted_base *)0x0;
              local_178 = (undefined1  [8])0xe9f173;
              bStack_170 = true;
              uStack_16f = 0xf1;
              uStack_16e = 0xe9;
              uStack_16d = 0;
              uStack_16c = 0;
              uStack_16b = 0;
              uStack_16a = 0;
              uStack_169 = 0;
              next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0] = 200;
              next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
              next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
              next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
              next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
              builtin_memcpy(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)local_178;
              next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)local_178 >> 8)
              ;
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
                   (uchar)((ulong)local_178 >> 0x10);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
                   (uchar)((ulong)local_178 >> 0x18);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
                   (uchar)((ulong)local_178 >> 0x20);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
                   (uchar)((ulong)local_178 >> 0x28);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
                   (uchar)((ulong)local_178 >> 0x30);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
                   (uchar)((ulong)local_178 >> 0x38);
              local_340 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_338 = "";
              pvVar16 = (iterator)0x1;
              pvVar17 = (iterator)0x0;
              local_158[0] = (class_property<bool>)(bool)SUB41(iVar11,0);
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,0,WARN,_cVar24,
                         (size_t)&local_340,0x25);
              boost::detail::shared_count::~shared_count(&sStack_150.pn);
              local_350 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_348 = "";
              local_360 = &boost::unit_test::basic_cstring<char_const>::null;
              local_358 = &boost::unit_test::basic_cstring<char_const>::null;
              file_06.m_end = (iterator)0x26;
              file_06.m_begin = (iterator)&local_350;
              msg_06.m_end = pvVar17;
              msg_06.m_begin = pvVar16;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                         (size_t)&local_360,msg_06);
              next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0] = 0x88;
              next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
              next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
              next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
              next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
              builtin_memcpy(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
              next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = 0xdc;
              next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = ';';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf7;
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
              next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
              local_208 = (undefined1  [8])
                          (ulong)(pCVar13->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[0x28]->nTime;
              local_158[0] = (class_property<bool>)
                             (class_property<bool>)((undefined1  [8])time == local_208);
              sStack_150.px = (element_type *)0x0;
              sStack_150.pn.pi_ = (sp_counted_base *)0x0;
              local_178 = (undefined1  [8])0xe9efd7;
              bStack_170 = true;
              uStack_16f = 0xf0;
              uStack_16e = 0xe9;
              uStack_16d = '\0';
              uStack_16c = '\0';
              uStack_16b = '\0';
              uStack_16a = '\0';
              uStack_169 = '\0';
              local_138.m_empty = false;
              local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
              uStack_120 = (int *)&local_1f0;
              local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
              local_200 = (element_type *)local_208;
              bStack_1c0 = false;
              local_1c8[0] = (class_property<bool>)0x28;
              local_1c8._1_7_ = 0x13ae4;
              local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              paStack_1b0 = (assertion_result *)&local_200;
              pvVar16 = (iterator)0x1;
              pvVar17 = (iterator)0x2;
              local_1f0._0_8_ = &time;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,2,REQUIRE,
                         0xfce57c,(size_t)local_178,0x26,&local_138,"active[40]->GetBlockTime()",
                         local_1c8);
              boost::detail::shared_count::~shared_count(&sStack_150.pn);
              max_time = -1;
              local_378 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_370 = "";
              local_388 = &boost::unit_test::basic_cstring<char_const>::null;
              local_380 = &boost::unit_test::basic_cstring<char_const>::null;
              file_07.m_end = (iterator)0x29;
              file_07.m_begin = (iterator)&local_378;
              msg_07.m_end = pvVar17;
              msg_07.m_begin = pvVar16;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                         (size_t)&local_388,msg_07);
              puVar4 = (pCVar13->m_chain).vChain.
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_start[0x32]->phashBlock;
              if (puVar4 != (uint256 *)0x0) {
                pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                         super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                         .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
                uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                local_1b8.pi_ =
                     *(sp_counted_base **)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                pbVar10 = &puVar4->super_base_blob<256U>;
                paStack_1b0._0_1_ = (pbVar10->m_data)._M_elems[0x18];
                paStack_1b0._1_1_ = (pbVar10->m_data)._M_elems[0x19];
                paStack_1b0._2_1_ = (pbVar10->m_data)._M_elems[0x1a];
                paStack_1b0._3_1_ = (pbVar10->m_data)._M_elems[0x1b];
                paStack_1b0._4_1_ = (pbVar10->m_data)._M_elems[0x1c];
                paStack_1b0._5_1_ = (pbVar10->m_data)._M_elems[0x1d];
                paStack_1b0._6_1_ = (pbVar10->m_data)._M_elems[0x1e];
                paStack_1b0._7_1_ = (pbVar10->m_data)._M_elems[0x1f];
                local_1c8[0] = SUB81(*(undefined8 *)&puVar4->super_base_blob<256U>,0);
                local_1c8._1_7_ =
                     (undefined7)((ulong)*(undefined8 *)&puVar4->super_base_blob<256U> >> 8);
                bStack_1c0 = SUB81(uVar6,0);
                uStack_1bf = (undefined7)((ulong)uVar6 >> 8);
                local_f8 = (undefined1  [16])0x0;
                local_108 = (undefined1  [16])0x0;
                local_118 = (undefined1  [16])0x0;
                local_138._vptr_lazy_ostream = (_func_int **)0x0;
                local_138.m_empty = false;
                local_138._9_7_ = 0;
                local_128 = (undefined1  [8])0x0;
                _cVar24 = 0x3f6ece;
                uStack_120 = (int *)&max_time;
                iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,local_1c8,&local_138);
                sStack_150.px = (element_type *)0x0;
                sStack_150.pn.pi_ = (sp_counted_base *)0x0;
                local_178 = (undefined1  [8])0xe9f1d4;
                bStack_170 = true;
                uStack_16f = 0xf2;
                uStack_16e = 0xe9;
                uStack_16d = 0;
                uStack_16c = 0;
                uStack_16b = 0;
                uStack_16a = 0;
                uStack_169 = 0;
                next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0] = 200;
                next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
                next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
                next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
                next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
                builtin_memcpy(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)local_178;
                next_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
                     (uchar)((ulong)local_178 >> 8);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
                     (uchar)((ulong)local_178 >> 0x10);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
                     (uchar)((ulong)local_178 >> 0x18);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
                     (uchar)((ulong)local_178 >> 0x20);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
                     (uchar)((ulong)local_178 >> 0x28);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
                     (uchar)((ulong)local_178 >> 0x30);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
                     (uchar)((ulong)local_178 >> 0x38);
                local_398 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                ;
                local_390 = "";
                pvVar16 = (iterator)0x1;
                pvVar17 = (iterator)0x0;
                local_158[0] = (class_property<bool>)(bool)SUB41(iVar11,0);
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,0,WARN,_cVar24
                           ,(size_t)&local_398,0x29);
                boost::detail::shared_count::~shared_count(&sStack_150.pn);
                local_3a8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                ;
                local_3a0 = "";
                local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
                file_08.m_end = (iterator)0x2a;
                file_08.m_begin = (iterator)&local_3a8;
                msg_08.m_end = pvVar17;
                msg_08.m_begin = pvVar16;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                           (size_t)&local_3b8,msg_08);
                next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0] = 0x88;
                next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
                next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
                next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
                next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
                builtin_memcpy(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10,"8!<\x01",5);
                next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = 0xdc;
                next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = ';';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf7;
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
                next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
                local_208 = (undefined1  [8])
                            (ulong)(pCVar13->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[0x32]->nTimeMax;
                local_158[0] = (class_property<bool>)
                               (class_property<bool>)((undefined1  [8])max_time == local_208);
                sStack_150.px = (element_type *)0x0;
                sStack_150.pn.pi_ = (sp_counted_base *)0x0;
                local_178 = (undefined1  [8])0xe9efd7;
                bStack_170 = true;
                uStack_16f = 0xf0;
                uStack_16e = 0xe9;
                uStack_16d = '\0';
                uStack_16c = '\0';
                uStack_16b = '\0';
                uStack_16a = '\0';
                uStack_169 = '\0';
                local_138.m_empty = false;
                local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
                uStack_120 = (int *)&local_1f0;
                local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                local_200 = (element_type *)local_208;
                bStack_1c0 = false;
                local_1c8[0] = (class_property<bool>)0x28;
                local_1c8._1_7_ = 0x13ae4;
                local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                paStack_1b0 = (assertion_result *)&local_200;
                pvVar16 = (iterator)0x1;
                pvVar17 = (iterator)0x2;
                local_1f0._0_8_ = &max_time;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,2,REQUIRE,
                           0xe9f221,(size_t)local_178,0x2a,&local_138,
                           "active[50]->GetBlockTimeMax()",local_1c8);
                boost::detail::shared_count::~shared_count(&sStack_150.pn);
                mtp_time = -1;
                local_3d0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                ;
                local_3c8 = "";
                local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_09.m_end = (iterator)0x2d;
                file_09.m_begin = (iterator)&local_3d0;
                msg_09.m_end = pvVar17;
                msg_09.m_begin = pvVar16;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
                           (size_t)&local_3e0,msg_09);
                puVar4 = (pCVar13->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_start[0x3c]->phashBlock;
                if (puVar4 != (uint256 *)0x0) {
                  pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                           super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
                  uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                  local_1b8.pi_ =
                       *(sp_counted_base **)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10)
                  ;
                  pbVar10 = &puVar4->super_base_blob<256U>;
                  paStack_1b0._0_1_ = (pbVar10->m_data)._M_elems[0x18];
                  paStack_1b0._1_1_ = (pbVar10->m_data)._M_elems[0x19];
                  paStack_1b0._2_1_ = (pbVar10->m_data)._M_elems[0x1a];
                  paStack_1b0._3_1_ = (pbVar10->m_data)._M_elems[0x1b];
                  paStack_1b0._4_1_ = (pbVar10->m_data)._M_elems[0x1c];
                  paStack_1b0._5_1_ = (pbVar10->m_data)._M_elems[0x1d];
                  paStack_1b0._6_1_ = (pbVar10->m_data)._M_elems[0x1e];
                  paStack_1b0._7_1_ = (pbVar10->m_data)._M_elems[0x1f];
                  local_1c8[0] = SUB81(*(undefined8 *)&puVar4->super_base_blob<256U>,0);
                  local_1c8._1_7_ =
                       (undefined7)((ulong)*(undefined8 *)&puVar4->super_base_blob<256U> >> 8);
                  bStack_1c0 = SUB81(uVar6,0);
                  uStack_1bf = (undefined7)((ulong)uVar6 >> 8);
                  local_f8 = (undefined1  [16])0x0;
                  local_108 = (undefined1  [16])0x0;
                  _local_128 = (lazy_ostream)0x0;
                  local_138._vptr_lazy_ostream = (_func_int **)0x0;
                  local_138.m_empty = false;
                  local_138._9_7_ = 0;
                  local_118._8_8_ = 0;
                  local_118._0_8_ = &mtp_time;
                  _cVar24 = 0x3f719d;
                  iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,local_1c8,&local_138);
                  sStack_150.px = (element_type *)0x0;
                  sStack_150.pn.pi_ = (sp_counted_base *)0x0;
                  local_178 = (undefined1  [8])0xe9f248;
                  bStack_170 = true;
                  uStack_16f = 0xf2;
                  uStack_16e = 0xe9;
                  uStack_16d = 0;
                  uStack_16c = 0;
                  uStack_16b = 0;
                  uStack_16a = 0;
                  uStack_169 = 0;
                  next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0] = 200;
                  next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe1;
                  next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
                  next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
                  next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '!';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '<';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)local_178;
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
                       (uchar)((ulong)local_178 >> 8);
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
                       (uchar)((ulong)local_178 >> 0x10);
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
                       (uchar)((ulong)local_178 >> 0x18);
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
                       (uchar)((ulong)local_178 >> 0x20);
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
                       (uchar)((ulong)local_178 >> 0x28);
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
                       (uchar)((ulong)local_178 >> 0x30);
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
                       (uchar)((ulong)local_178 >> 0x38);
                  local_3f0 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                  ;
                  local_3e8 = "";
                  pvVar16 = (iterator)0x1;
                  pvVar17 = (iterator)0x0;
                  local_158[0] = (class_property<bool>)(bool)SUB41(iVar11,0);
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,0,WARN,
                             _cVar24,(size_t)&local_3f0,0x2d);
                  boost::detail::shared_count::~shared_count(&sStack_150.pn);
                  local_400 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                  ;
                  local_3f8 = "";
                  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_10.m_end = (iterator)0x2e;
                  file_10.m_begin = (iterator)&local_400;
                  msg_10.m_end = pvVar17;
                  msg_10.m_begin = pvVar16;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                             (size_t)&local_410,msg_10);
                  next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0] = 0x88;
                  next_hash.super_base_blob<256U>.m_data._M_elems[1] = 0xe0;
                  next_hash.super_base_blob<256U>.m_data._M_elems[2] = ':';
                  next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
                  next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '!';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '<';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = 0xdc;
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = ';';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xf7;
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
                  local_208 = (undefined1  [8])
                              CBlockIndex::GetMedianTimePast
                                        ((pCVar13->m_chain).vChain.
                                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start[0x3c]);
                  local_158[0] = (class_property<bool>)
                                 (class_property<bool>)((undefined1  [8])mtp_time == local_208);
                  sStack_150.px = (element_type *)0x0;
                  sStack_150.pn.pi_ = (sp_counted_base *)0x0;
                  local_178 = (undefined1  [8])0xe9efd7;
                  bStack_170 = true;
                  uStack_16f = 0xf0;
                  uStack_16e = 0xe9;
                  uStack_16d = 0;
                  uStack_16c = 0;
                  uStack_16b = 0;
                  uStack_16a = 0;
                  uStack_169 = 0;
                  local_138.m_empty = false;
                  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
                  uStack_120 = (int *)&local_1f0;
                  local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                  local_200 = (element_type *)local_208;
                  bStack_1c0 = false;
                  local_1c8[0] = (class_property<bool>)0x28;
                  local_1c8._1_7_ = 0x13ae4;
                  local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  paStack_1b0 = (assertion_result *)&local_200;
                  pvVar16 = (iterator)0x1;
                  pvVar17 = (iterator)0x2;
                  local_1f0._0_8_ = &mtp_time;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,2,REQUIRE,
                             0xe9f295,(size_t)local_178,0x2e,&local_138,
                             "active[60]->GetMedianTimePast()",local_1c8);
                  boost::detail::shared_count::~shared_count(&sStack_150.pn);
                  cur_active = false;
                  next_active = false;
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
                  next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
                  local_428 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                  ;
                  local_420 = "";
                  local_43c._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                  local_43c._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                  file_11.m_end = (iterator)0x32;
                  file_11.m_begin = (iterator)&local_428;
                  msg_11.m_end = pvVar17;
                  msg_11.m_begin = pvVar16;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                             (size_t)(local_43c + 4),msg_11);
                  sStack_150.px = (element_type *)(sStack_150._1_8_ << 8);
                  local_158 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
                  sStack_150.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  uStack_140 = (assertion_result *)0xf73bdc;
                  iVar11 = (int)((ulong)((long)(pCVar13->m_chain).vChain.
                                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pCVar13->m_chain).vChain.
                                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
                  local_210._0_4_ = iVar11;
                  local_208 = (undefined1  [8])local_43c;
                  local_178[0] = iVar11 == 100;
                  local_43c[0] = 'd';
                  local_43c[1] = '\0';
                  local_43c[2] = '\0';
                  local_43c[3] = '\0';
                  bStack_170 = false;
                  uStack_16f = '\0';
                  uStack_16e = '\0';
                  uStack_16d = '\0';
                  uStack_16c = '\0';
                  uStack_16b = '\0';
                  uStack_16a = '\0';
                  uStack_169 = '\0';
                  local_168.pi_._0_1_ = '\0';
                  local_168.pi_._1_1_ = '\0';
                  local_168.pi_._2_1_ = '\0';
                  local_168.pi_._3_1_ = '\0';
                  local_168.pi_._4_1_ = '\0';
                  local_168.pi_._5_1_ = '\0';
                  local_168.pi_._6_1_ = '\0';
                  local_168.pi_._7_1_ = '\0';
                  local_1f0._0_8_ =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                  ;
                  local_1f0.m_message.px = (element_type *)0xe9f039;
                  local_200 = (element_type *)local_210;
                  local_138.m_empty = false;
                  local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
                  uStack_120 = (int *)&local_200;
                  local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                  bStack_1c0 = false;
                  local_1c8[0] = (class_property<bool>)0x48;
                  local_1c8._1_7_ = 0x13ae2;
                  local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  paStack_1b0 = (assertion_result *)local_208;
                  pvVar16 = (iterator)0x1;
                  pvVar17 = (iterator)0x2;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_178,(lazy_ostream *)local_158,1,2,REQUIRE,
                             0xe9f2be,(size_t)&local_1f0,0x32,&local_138,"100",local_1c8);
                  boost::detail::shared_count::~shared_count(&local_168);
                  local_450 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                  ;
                  local_448 = "";
                  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_12.m_end = (iterator)0x33;
                  file_12.m_begin = (iterator)&local_450;
                  msg_12.m_end = pvVar17;
                  msg_12.m_begin = pvVar16;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                             (size_t)&local_460,msg_12);
                  puVar4 = (pCVar13->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_start[99]->phashBlock;
                  if (puVar4 != (uint256 *)0x0) {
                    pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                             super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                             .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
                    local_158 = *(undefined1 (*) [8])&puVar4->super_base_blob<256U>;
                    sStack_150.px =
                         *(element_type **)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
                    sStack_150.pn.pi_ =
                         *(sp_counted_base **)
                          ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                    uStack_140 = *(assertion_result **)
                                  ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
                    local_f8 = (undefined1  [16])0x0;
                    _local_128 = (lazy_ostream)0x0;
                    local_138._vptr_lazy_ostream = (_func_int **)0x0;
                    local_138.m_empty = false;
                    local_138._9_7_ = 0;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = &cur_active;
                    local_118 = auVar7 << 0x40;
                    uStack_198 = 0;
                    local_190 = 0;
                    uStack_188 = 0;
                    paStack_1b0 = (assertion_result *)0x0;
                    uStack_1a8 = 0;
                    bStack_1c0 = false;
                    uStack_1bf = 0;
                    local_1b8.pi_ = (sp_counted_base *)0x0;
                    local_180 = 0;
                    local_1a0 = &next_active;
                    local_1c8[0] = SUB81(&next_hash,0);
                    local_1c8._1_7_ = (undefined7)((ulong)&next_hash >> 8);
                    local_108._8_8_ = 0;
                    local_108._0_8_ = local_1c8;
                    local_108 = local_108 << 0x40;
                    _cVar24 = 0x3f7630;
                    iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,local_158);
                    local_1f0.p_predicate_value.super_readonly_property<bool>.
                    super_class_property<bool>.value =
                         (readonly_property<bool>)(readonly_property<bool>)(char)iVar11;
                    local_1f0.m_message.px = (element_type *)0x0;
                    local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                    local_200 = (element_type *)0xe9f2ce;
                    local_1f8 = "";
                    bStack_170 = false;
                    local_178 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
                    local_168.pi_._0_1_ = '8';
                    local_168.pi_._1_1_ = '!';
                    local_168.pi_._2_1_ = '<';
                    local_168.pi_._3_1_ = '\x01';
                    local_168.pi_._4_1_ = '\0';
                    local_168.pi_._5_1_ = '\0';
                    local_168.pi_._6_1_ = '\0';
                    local_168.pi_._7_1_ = '\0';
                    uStack_160 = '\0';
                    uStack_15f = (uchar)((ulong)&local_200 >> 8);
                    uStack_15e = (uchar)((ulong)&local_200 >> 0x10);
                    uStack_15d = (uchar)((ulong)&local_200 >> 0x18);
                    uStack_15c = (uchar)((ulong)&local_200 >> 0x20);
                    uStack_15b = (uchar)((ulong)&local_200 >> 0x28);
                    uStack_15a = (uchar)((ulong)&local_200 >> 0x30);
                    uStack_159 = (uchar)((ulong)&local_200 >> 0x38);
                    local_470 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                    ;
                    local_468 = "";
                    pvVar16 = (iterator)0x1;
                    pvVar17 = (iterator)0x0;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_1f0,(lazy_ostream *)local_178,1,0,WARN,_cVar24,
                               (size_t)&local_470,0x33);
                    boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
                    local_480 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                    ;
                    local_478 = "";
                    local_490 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
                    _cVar24 = 0x3f7711;
                    file_13.m_end = (iterator)0x34;
                    file_13.m_begin = (iterator)&local_480;
                    msg_13.m_end = pvVar17;
                    msg_13.m_begin = pvVar16;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                               (size_t)&local_490,msg_13);
                    local_1c8[0] = (class_property<bool>)(class_property<bool>)cur_active;
                    bStack_1c0 = false;
                    uStack_1bf = 0;
                    local_1b8.pi_ = (sp_counted_base *)0x0;
                    local_158 = (undefined1  [8])0xe9f366;
                    sStack_150.px = (element_type *)0xe9f370;
                    local_138.m_empty = false;
                    local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
                    local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                    local_4a0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                    ;
                    local_498 = "";
                    pvVar16 = (iterator)0x1;
                    pvVar17 = (iterator)0x0;
                    uStack_120 = (int *)local_158;
                    boost::test_tools::tt_detail::report_assertion
                              ((assertion_result *)local_1c8,&local_138,1,0,WARN,_cVar24,
                               (size_t)&local_4a0,0x34);
                    boost::detail::shared_count::~shared_count(&local_1b8);
                    local_4b0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                    ;
                    local_4a8 = "";
                    local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
                    _cVar24 = 0x3f77df;
                    file_14.m_end = (iterator)0x35;
                    file_14.m_begin = (iterator)&local_4b0;
                    msg_14.m_end = pvVar17;
                    msg_14.m_begin = pvVar16;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                               (size_t)&local_4c0,msg_14);
                    local_1c8[0] = (class_property<bool>)(class_property<bool>)next_active;
                    bStack_1c0 = false;
                    uStack_1bf = 0;
                    local_1b8.pi_ = (sp_counted_base *)0x0;
                    local_158 = (undefined1  [8])0xe9f421;
                    sStack_150.px = (element_type *)0xe9f42c;
                    local_138.m_empty = false;
                    local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
                    uStack_120 = (int *)local_158;
                    local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                    local_4d0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                    ;
                    local_4c8 = "";
                    pvVar16 = (iterator)0x1;
                    pvVar17 = (iterator)0x0;
                    boost::test_tools::tt_detail::report_assertion
                              ((assertion_result *)local_1c8,&local_138,1,0,WARN,_cVar24,
                               (size_t)&local_4d0,0x35);
                    boost::detail::shared_count::~shared_count(&local_1b8);
                    local_4e0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                    ;
                    local_4d8 = "";
                    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
                    file_15.m_end = (iterator)0x36;
                    file_15.m_begin = (iterator)&local_4e0;
                    msg_15.m_end = pvVar17;
                    msg_15.m_begin = pvVar16;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                               (size_t)&local_4f0,msg_15);
                    sStack_150.px = (element_type *)(sStack_150._1_8_ << 8);
                    local_158 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
                    sStack_150.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                    uStack_140 = (assertion_result *)0xf73bdc;
                    puVar4 = (pCVar13->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[100]->phashBlock;
                    if (puVar4 != (uint256 *)0x0) {
                      local_178 = *(undefined1 (*) [8])&puVar4->super_base_blob<256U>;
                      bStack_170 = (bool)(puVar4->super_base_blob<256U>).m_data._M_elems[8];
                      uStack_16f = (puVar4->super_base_blob<256U>).m_data._M_elems[9];
                      uStack_16e = (puVar4->super_base_blob<256U>).m_data._M_elems[10];
                      uStack_16d = (puVar4->super_base_blob<256U>).m_data._M_elems[0xb];
                      uStack_16c = (puVar4->super_base_blob<256U>).m_data._M_elems[0xc];
                      uStack_16b = (puVar4->super_base_blob<256U>).m_data._M_elems[0xd];
                      uStack_16a = (puVar4->super_base_blob<256U>).m_data._M_elems[0xe];
                      uStack_169 = (puVar4->super_base_blob<256U>).m_data._M_elems[0xf];
                      local_168.pi_._0_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x10];
                      local_168.pi_._1_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x11];
                      local_168.pi_._2_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x12];
                      local_168.pi_._3_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x13];
                      local_168.pi_._4_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x14];
                      local_168.pi_._5_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x15];
                      local_168.pi_._6_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x16];
                      local_168.pi_._7_1_ = (puVar4->super_base_blob<256U>).m_data._M_elems[0x17];
                      uStack_160 = (puVar4->super_base_blob<256U>).m_data._M_elems[0x18];
                      uStack_15f = (puVar4->super_base_blob<256U>).m_data._M_elems[0x19];
                      uStack_15e = (puVar4->super_base_blob<256U>).m_data._M_elems[0x1a];
                      uStack_15d = (puVar4->super_base_blob<256U>).m_data._M_elems[0x1b];
                      uStack_15c = (puVar4->super_base_blob<256U>).m_data._M_elems[0x1c];
                      uStack_15b = (puVar4->super_base_blob<256U>).m_data._M_elems[0x1d];
                      uStack_15a = (puVar4->super_base_blob<256U>).m_data._M_elems[0x1e];
                      uStack_159 = (puVar4->super_base_blob<256U>).m_data._M_elems[0x1f];
                      auVar22[0] = -((uchar)local_168.pi_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
                      auVar22[1] = -(local_168.pi_._1_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
                      auVar22[2] = -(local_168.pi_._2_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
                      auVar22[3] = -(local_168.pi_._3_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
                      auVar22[4] = -(local_168.pi_._4_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
                      auVar22[5] = -(local_168.pi_._5_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
                      auVar22[6] = -(local_168.pi_._6_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
                      auVar22[7] = -(local_168.pi_._7_1_ ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
                      auVar22[8] = -(uStack_160 ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
                      auVar22[9] = -(uStack_15f ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
                      auVar22[10] = -(uStack_15e ==
                                     next_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
                      auVar22[0xb] = -(uStack_15d ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
                      auVar22[0xc] = -(uStack_15c ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
                      auVar22[0xd] = -(uStack_15b ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
                      auVar22[0xe] = -(uStack_15a ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
                      auVar22[0xf] = -(uStack_159 ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
                      auVar20[0] = -(*(uchar *)&puVar4->super_base_blob<256U> ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[0]);
                      auVar20[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[1] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[1]);
                      auVar20[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[2] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[2]);
                      auVar20[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[3] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[3]);
                      auVar20[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[4] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[4]);
                      auVar20[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[5] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[5]);
                      auVar20[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[6] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[6]);
                      auVar20[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[7] ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[7]);
                      auVar20[8] = -(bStack_170 ==
                                    (bool)next_hash.super_base_blob<256U>.m_data._M_elems[8]);
                      auVar20[9] = -(uStack_16f ==
                                    next_hash.super_base_blob<256U>.m_data._M_elems[9]);
                      auVar20[10] = -(uStack_16e ==
                                     next_hash.super_base_blob<256U>.m_data._M_elems[10]);
                      auVar20[0xb] = -(uStack_16d ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
                      auVar20[0xc] = -(uStack_16c ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
                      auVar20[0xd] = -(uStack_16b ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
                      auVar20[0xe] = -(uStack_16a ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
                      auVar20[0xf] = -(uStack_169 ==
                                      next_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
                      auVar20 = auVar20 & auVar22;
                      local_1f0.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value =
                           (readonly_property<bool>)
                           (readonly_property<bool>)
                           ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
                      local_1f0.m_message.px = (element_type *)0x0;
                      local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                      local_200 = (element_type *)0xe9efd7;
                      local_1f8 = "";
                      local_208 = (undefined1  [8])&next_hash;
                      local_138.m_empty = false;
                      local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013aed38;
                      uStack_120 = (int *)local_208;
                      local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                      bStack_1c0 = false;
                      local_1c8[0] = (class_property<bool>)0x38;
                      local_1c8._1_7_ = 0x13aed;
                      local_1b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      paStack_1b0 = (assertion_result *)local_210;
                      pvVar16 = (iterator)0x1;
                      pvVar17 = (iterator)0x2;
                      local_210 = (undefined1  [8])local_178;
                      boost::test_tools::tt_detail::report_assertion
                                (&local_1f0,(lazy_ostream *)local_158,1,2,REQUIRE,0xe9f371,
                                 (size_t)&local_200,0x36,&local_138,"active[100]->GetBlockHash()",
                                 (assertion_result *)local_1c8);
                      boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
                      next_active = false;
                      cur_active = false;
                      local_500 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                      ;
                      local_4f8 = "";
                      local_510 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_508 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_16.m_end = (iterator)0x38;
                      file_16.m_begin = (iterator)&local_500;
                      msg_16.m_end = pvVar17;
                      msg_16.m_begin = pvVar16;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                                 (size_t)&local_510,msg_16);
                      puVar4 = (pCVar13->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[100]->phashBlock;
                      if (puVar4 != (uint256 *)0x0) {
                        pCVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
                        local_158 = *(undefined1 (*) [8])&puVar4->super_base_blob<256U>;
                        sStack_150.px =
                             *(element_type **)((puVar4->super_base_blob<256U>).m_data._M_elems + 8)
                        ;
                        sStack_150.pn.pi_ =
                             *(sp_counted_base **)
                              ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
                        uStack_140 = *(assertion_result **)
                                      ((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
                        local_f8 = (undefined1  [16])0x0;
                        _local_128 = (lazy_ostream)0x0;
                        local_138._vptr_lazy_ostream = (_func_int **)0x0;
                        local_138.m_empty = false;
                        local_138._9_7_ = 0;
                        auVar8._8_8_ = 0;
                        auVar8._0_8_ = &cur_active;
                        local_118 = auVar8 << 0x40;
                        uStack_1a8 = 0;
                        uStack_188 = 0;
                        local_180 = 0;
                        uStack_198 = 0;
                        local_190 = 0;
                        local_1b8.pi_ = (sp_counted_base *)0x0;
                        paStack_1b0 = (assertion_result *)0x0;
                        local_1c8[0] = (class_property<bool>)0x0;
                        local_1c8._1_7_ = 0;
                        bStack_1c0 = false;
                        uStack_1bf = 0;
                        local_1a0 = &next_active;
                        auVar9._8_8_ = 0;
                        auVar9._0_8_ = (assertion_result *)local_1c8;
                        local_108 = auVar9 << 0x40;
                        _cVar24 = 0x3f7b39;
                        iVar11 = (*pCVar3->_vptr_Chain[10])(pCVar3,local_158);
                        local_1f0.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value =
                             (readonly_property<bool>)(readonly_property<bool>)(char)iVar11;
                        local_1f0.m_message.px = (element_type *)0x0;
                        local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                        local_200 = (element_type *)0xe9f397;
                        local_1f8 = "";
                        bStack_170 = false;
                        local_178 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
                        local_168.pi_._0_1_ = 0x38;
                        local_168.pi_._1_1_ = 0x21;
                        local_168.pi_._2_1_ = 0x3c;
                        local_168.pi_._3_1_ = 1;
                        local_168.pi_._4_1_ = 0;
                        local_168.pi_._5_1_ = 0;
                        local_168.pi_._6_1_ = 0;
                        local_168.pi_._7_1_ = 0;
                        uStack_160 = 0;
                        uStack_15f = (uchar)((ulong)&local_200 >> 8);
                        uStack_15e = (uchar)((ulong)&local_200 >> 0x10);
                        uStack_15d = (uchar)((ulong)&local_200 >> 0x18);
                        uStack_15c = (uchar)((ulong)&local_200 >> 0x20);
                        uStack_15b = (uchar)((ulong)&local_200 >> 0x28);
                        uStack_15a = (uchar)((ulong)&local_200 >> 0x30);
                        uStack_159 = (uchar)((ulong)&local_200 >> 0x38);
                        local_520 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_518 = "";
                        pvVar16 = (iterator)0x1;
                        pvVar17 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  (&local_1f0,(lazy_ostream *)local_178,1,0,WARN,_cVar24,
                                   (size_t)&local_520,0x38);
                        boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
                        local_530 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_528 = "";
                        local_540 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_538 = &boost::unit_test::basic_cstring<char_const>::null;
                        _cVar24 = 0x3f7c13;
                        file_17.m_end = (iterator)0x39;
                        file_17.m_begin = (iterator)&local_530;
                        msg_17.m_end = pvVar17;
                        msg_17.m_begin = pvVar16;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                                   (size_t)&local_540,msg_17);
                        local_1c8[0] = (class_property<bool>)(class_property<bool>)cur_active;
                        bStack_1c0 = false;
                        uStack_1bf = 0;
                        local_1b8.pi_ = (sp_counted_base *)0x0;
                        local_158 = (undefined1  [8])0xe9f366;
                        sStack_150.px = (element_type *)0xe9f370;
                        local_138.m_empty = false;
                        local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
                        local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                        local_550 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_548 = "";
                        pvVar16 = (iterator)0x1;
                        pvVar17 = (iterator)0x0;
                        uStack_120 = (int *)local_158;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)local_1c8,&local_138,1,0,WARN,_cVar24,
                                   (size_t)&local_550,0x39);
                        boost::detail::shared_count::~shared_count(&local_1b8);
                        local_560 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_558 = "";
                        local_570 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_568 = &boost::unit_test::basic_cstring<char_const>::null;
                        _cVar24 = 0x3f7cd8;
                        file_18.m_end = (iterator)0x3a;
                        file_18.m_begin = (iterator)&local_560;
                        msg_18.m_end = pvVar17;
                        msg_18.m_begin = pvVar16;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                                   (size_t)&local_570,msg_18);
                        local_1c8[0] = (class_property<bool>)(next_active ^ 1);
                        bStack_1c0 = false;
                        uStack_1bf = 0;
                        local_1b8.pi_ = (sp_counted_base *)0x0;
                        local_158 = (undefined1  [8])0xe9f420;
                        sStack_150.px = (element_type *)0xe9f42c;
                        local_138.m_empty = false;
                        local_138._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
                        uStack_120 = (int *)local_158;
                        local_128 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                        local_580 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_578 = "";
                        pvVar16 = (iterator)0x1;
                        pvVar17 = (iterator)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)local_1c8,&local_138,1,0,WARN,_cVar24,
                                   (size_t)&local_580,0x3a);
                        boost::detail::shared_count::~shared_count(&local_1b8);
                        local_590 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_588 = "";
                        local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_598 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_19.m_end = (iterator)0x3c;
                        file_19.m_begin = (iterator)&local_590;
                        msg_19.m_end = pvVar17;
                        msg_19.m_begin = pvVar16;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                                   (size_t)&local_5a0,msg_19);
                        local_1b8.pi_ = (sp_counted_base *)0x0;
                        paStack_1b0 = (assertion_result *)0x0;
                        local_1c8[0] = (class_property<bool>)0x0;
                        local_1c8._1_7_ = 0;
                        bStack_1c0 = false;
                        uStack_1bf = 0;
                        local_f8 = (undefined1  [16])0x0;
                        local_108 = (undefined1  [16])0x0;
                        local_118 = (undefined1  [16])0x0;
                        _local_128 = (lazy_ostream)0x0;
                        local_138._vptr_lazy_ostream = (_func_int **)0x0;
                        local_138.m_empty = false;
                        local_138._9_7_ = 0;
                        _cVar24 = 0x3f7de9;
                        iVar11 = (*((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
                                    _M_t.
                                    super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                                    .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)
                                   ->_vptr_Chain[10])();
                        local_178 = (undefined1  [8])(CONCAT71(local_178._1_7_,(char)iVar11) ^ 1);
                        bStack_170 = false;
                        uStack_16f = 0;
                        uStack_16e = 0;
                        uStack_16d = 0;
                        uStack_16c = 0;
                        uStack_16b = 0;
                        uStack_16a = 0;
                        uStack_169 = 0;
                        local_168.pi_._0_1_ = 0;
                        local_168.pi_._1_1_ = 0;
                        local_168.pi_._2_1_ = 0;
                        local_168.pi_._3_1_ = 0;
                        local_168.pi_._4_1_ = 0;
                        local_168.pi_._5_1_ = 0;
                        local_168.pi_._6_1_ = 0;
                        local_168.pi_._7_1_ = 0;
                        local_1f0._0_8_ = "!chain->findBlock({}, FoundBlock())";
                        local_1f0.m_message.px = (element_type *)0xe9f450;
                        sStack_150.px = (element_type *)(sStack_150._1_8_ << 8);
                        local_158 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
                        sStack_150.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                        local_5b0 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                        ;
                        local_5a8 = "";
                        uStack_140 = &local_1f0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)local_178,(lazy_ostream *)local_158,1,0,WARN,
                                   _cVar24,(size_t)&local_5b0,0x3c);
                        boost::detail::shared_count::~shared_count(&local_168);
                        std::
                        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                   *)local_98);
                        std::unique_lock<std::recursive_mutex>::~unique_lock
                                  (&criticalblock11.super_unique_lock);
                        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
                          __stack_chk_fail();
                        }
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(findBlock)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();

    uint256 hash;
    BOOST_CHECK(chain->findBlock(active[10]->GetBlockHash(), FoundBlock().hash(hash)));
    BOOST_CHECK_EQUAL(hash, active[10]->GetBlockHash());

    int height = -1;
    BOOST_CHECK(chain->findBlock(active[20]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, active[20]->nHeight);

    CBlock data;
    BOOST_CHECK(chain->findBlock(active[30]->GetBlockHash(), FoundBlock().data(data)));
    BOOST_CHECK_EQUAL(data.GetHash(), active[30]->GetBlockHash());

    int64_t time = -1;
    BOOST_CHECK(chain->findBlock(active[40]->GetBlockHash(), FoundBlock().time(time)));
    BOOST_CHECK_EQUAL(time, active[40]->GetBlockTime());

    int64_t max_time = -1;
    BOOST_CHECK(chain->findBlock(active[50]->GetBlockHash(), FoundBlock().maxTime(max_time)));
    BOOST_CHECK_EQUAL(max_time, active[50]->GetBlockTimeMax());

    int64_t mtp_time = -1;
    BOOST_CHECK(chain->findBlock(active[60]->GetBlockHash(), FoundBlock().mtpTime(mtp_time)));
    BOOST_CHECK_EQUAL(mtp_time, active[60]->GetMedianTimePast());

    bool cur_active{false}, next_active{false};
    uint256 next_hash;
    BOOST_CHECK_EQUAL(active.Height(), 100);
    BOOST_CHECK(chain->findBlock(active[99]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active).hash(next_hash))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(next_active);
    BOOST_CHECK_EQUAL(next_hash, active[100]->GetBlockHash());
    cur_active = next_active = false;
    BOOST_CHECK(chain->findBlock(active[100]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(!next_active);

    BOOST_CHECK(!chain->findBlock({}, FoundBlock()));
}